

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O0

void __thiscall
Js::WebAssemblyModule::AddTableImport
          (WebAssemblyModule *this,char16 *modName,uint32 modNameLen,char16 *importName,
          uint32 importNameLen)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  WasmImport *__s;
  List<Wasm::WasmImport_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  TrackAllocData local_60;
  WasmImport *local_38;
  WasmImport *wi;
  char16 *pcStack_28;
  uint32 importNameLen_local;
  char16 *importName_local;
  char16 *pcStack_18;
  uint32 modNameLen_local;
  char16 *modName_local;
  WebAssemblyModule *this_local;
  
  pAVar1 = &this->m_alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  wi._4_4_ = importNameLen;
  pcStack_28 = importName;
  importName_local._4_4_ = modNameLen;
  pcStack_18 = modName;
  modName_local = (char16 *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&Wasm::WasmImport::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyModule.cpp"
             ,0x2b6);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar1,&local_60);
  __s = (WasmImport *)new<Memory::ArenaAllocator>(0x20,(ArenaAllocator *)pAVar1,0x3f67b0);
  memset(__s,0,0x20);
  __s->kind = Table;
  __s->importName = pcStack_28;
  __s->importNameLen = wi._4_4_;
  __s->modName = pcStack_18;
  __s->modNameLen = importName_local._4_4_;
  local_38 = __s;
  this_00 = Memory::
            WriteBarrierPtr<JsUtil::List<Wasm::WasmImport_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
            ::operator->(&this->m_imports);
  JsUtil::
  List<Wasm::WasmImport_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  Add(this_00,&local_38);
  Memory::WriteBarrierPtr<Wasm::WasmImport>::operator=(&this->m_tableImport,local_38);
  return;
}

Assistant:

void
WebAssemblyModule::AddTableImport(const char16* modName, uint32 modNameLen, const char16* importName, uint32 importNameLen)
{
    Wasm::WasmImport* wi = Anew(m_alloc, Wasm::WasmImport);
    wi->kind = Wasm::ExternalKinds::Table;
    wi->importName = importName;
    wi->importNameLen = importNameLen;
    wi->modName = modName;
    wi->modNameLen = modNameLen;
    m_imports->Add(wi);
    m_tableImport = wi;
}